

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

void __thiscall QTextDocument::adjustSize(QTextDocument *this)

{
  qreal width;
  int iVar1;
  int iVar2;
  int iVar3;
  QAbstractTextDocumentLayout *pQVar4;
  int iVar5;
  long in_FS_OFFSET;
  double dVar6;
  double in_XMM1_Qa;
  QFontMetrics fm;
  QFontMetrics local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)local_38,(QFont *)(*(long *)&this->field_0x8 + 0x128));
  local_40.d.d.ptr = (QExplicitlySharedDataPointer<QFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics(&local_40,(QFont *)local_38);
  iVar1 = QFontMetrics::horizontalAdvance(&local_40,(QChar)0x78);
  iVar5 = iVar1 * 0x50;
  setTextWidth(this,(double)iVar5);
  pQVar4 = documentLayout(this);
  dVar6 = (double)(**(code **)(*(long *)pQVar4 + 0x78))(pQVar4);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    in_XMM1_Qa = in_XMM1_Qa * 5.0;
    iVar2 = qt_int_sqrt((uint)(long)((dVar6 * in_XMM1_Qa) / 3.0));
    iVar3 = iVar5;
    if (SBORROW4(iVar2,iVar5) != iVar2 + iVar1 * -0x50 < 0) {
      iVar3 = iVar2;
    }
    setTextWidth(this,(double)iVar3);
    pQVar4 = documentLayout(this);
    dVar6 = (double)(**(code **)(*(long *)pQVar4 + 0x78))(pQVar4);
    if ((double)(iVar2 * 3) < in_XMM1_Qa * 5.0) {
      iVar3 = qt_int_sqrt((uint)(long)(dVar6 * (in_XMM1_Qa + in_XMM1_Qa)));
      if (SBORROW4(iVar3,iVar5) != iVar3 + iVar1 * -0x50 < 0) {
        iVar5 = iVar3;
      }
      setTextWidth(this,(double)iVar5);
    }
  }
  width = idealWidth(this);
  setTextWidth(this,width);
  QFontMetrics::~QFontMetrics(&local_40);
  QFont::~QFont((QFont *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::adjustSize()
{
    // Pull this private function in from qglobal.cpp
    QFont f = defaultFont();
    QFontMetrics fm(f);
    int mw =  fm.horizontalAdvance(u'x') * 80;
    int w = mw;
    setTextWidth(w);
    QSizeF size = documentLayout()->documentSize();
    if (size.width() != 0) {
        w = qt_int_sqrt((uint)(5 * size.height() * size.width() / 3));
        setTextWidth(qMin(w, mw));

        size = documentLayout()->documentSize();
        if (w*3 < 5*size.height()) {
            w = qt_int_sqrt((uint)(2 * size.height() * size.width()));
            setTextWidth(qMin(w, mw));
        }
    }
    setTextWidth(idealWidth());
}